

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O3

uint32_t secp256k1_testrand_int(uint32_t range)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = 0;
  uVar4 = range - 1;
  uVar1 = uVar4;
  if (uVar4 != 0) {
    do {
      uVar2 = uVar2 * 2 + 1;
      bVar7 = 1 < uVar1;
      uVar1 = uVar1 >> 1;
    } while (bVar7);
  }
  do {
    uVar1 = ((int)(secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
            (uint)(secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29)) +
            (int)secp256k1_test_state[0] & uVar2;
    uVar6 = secp256k1_test_state[1] << 0x11;
    uVar3 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar5 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar3;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar5;
    secp256k1_test_state[2] = uVar3 ^ uVar6;
    secp256k1_test_state[3] = uVar5 << 0x2d | uVar5 >> 0x13;
  } while (uVar4 < uVar1);
  return uVar1;
}

Assistant:

static uint32_t secp256k1_testrand_int(uint32_t range) {
    uint32_t mask = 0;
    uint32_t range_copy;
    /* Reduce range by 1, changing its meaning to "maximum value". */
    VERIFY_CHECK(range != 0);
    range -= 1;
    /* Count the number of bits in range. */
    range_copy = range;
    while (range_copy) {
        mask = (mask << 1) | 1U;
        range_copy >>= 1;
    }
    /* Generation loop. */
    while (1) {
        uint32_t val = secp256k1_testrand64() & mask;
        if (val <= range) return val;
    }
}